

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int defineAttribute(ELEMENT_TYPE *type,ATTRIBUTE_ID *attId,XML_Bool isCdata,XML_Bool isId,
                   XML_Char *value,XML_Parser parser)

{
  int iVar1;
  DEFAULT_ATTRIBUTE *pDVar2;
  int count;
  DEFAULT_ATTRIBUTE *temp;
  int i;
  DEFAULT_ATTRIBUTE *att;
  XML_Parser parser_local;
  XML_Char *value_local;
  XML_Bool isId_local;
  XML_Bool isCdata_local;
  ATTRIBUTE_ID *attId_local;
  ELEMENT_TYPE *type_local;
  
  if ((value != (XML_Char *)0x0) || (isId != '\0')) {
    for (temp._4_4_ = 0; temp._4_4_ < type->nDefaultAtts; temp._4_4_ = temp._4_4_ + 1) {
      if (attId == type->defaultAtts[temp._4_4_].id) {
        return 1;
      }
    }
    if (((isId != '\0') && (type->idAtt == (ATTRIBUTE_ID *)0x0)) && (attId->xmlns == '\0')) {
      type->idAtt = attId;
    }
  }
  if (type->nDefaultAtts == type->allocDefaultAtts) {
    if (type->allocDefaultAtts == 0) {
      type->allocDefaultAtts = 8;
      pDVar2 = (DEFAULT_ATTRIBUTE *)
               (*(parser->m_mem).malloc_fcn)((long)type->allocDefaultAtts * 0x18);
      type->defaultAtts = pDVar2;
      if (type->defaultAtts == (DEFAULT_ATTRIBUTE *)0x0) {
        type->allocDefaultAtts = 0;
        return 0;
      }
    }
    else {
      iVar1 = type->allocDefaultAtts << 1;
      pDVar2 = (DEFAULT_ATTRIBUTE *)
               (*(parser->m_mem).realloc_fcn)(type->defaultAtts,(long)iVar1 * 0x18);
      if (pDVar2 == (DEFAULT_ATTRIBUTE *)0x0) {
        return 0;
      }
      type->allocDefaultAtts = iVar1;
      type->defaultAtts = pDVar2;
    }
  }
  pDVar2 = type->defaultAtts + type->nDefaultAtts;
  pDVar2->id = attId;
  pDVar2->value = value;
  pDVar2->isCdata = isCdata;
  if (isCdata == '\0') {
    attId->maybeTokenized = '\x01';
  }
  type->nDefaultAtts = type->nDefaultAtts + 1;
  return 1;
}

Assistant:

static int
defineAttribute(ELEMENT_TYPE *type, ATTRIBUTE_ID *attId, XML_Bool isCdata,
                XML_Bool isId, const XML_Char *value, XML_Parser parser)
{
  DEFAULT_ATTRIBUTE *att;
  if (value || isId) {
    /* The handling of default attributes gets messed up if we have
       a default which duplicates a non-default. */
    int i;
    for (i = 0; i < type->nDefaultAtts; i++)
      if (attId == type->defaultAtts[i].id)
        return 1;
    if (isId && !type->idAtt && !attId->xmlns)
      type->idAtt = attId;
  }
  if (type->nDefaultAtts == type->allocDefaultAtts) {
    if (type->allocDefaultAtts == 0) {
      type->allocDefaultAtts = 8;
      type->defaultAtts = (DEFAULT_ATTRIBUTE *)MALLOC(parser, type->allocDefaultAtts
                            * sizeof(DEFAULT_ATTRIBUTE));
      if (!type->defaultAtts) {
        type->allocDefaultAtts = 0;
        return 0;
      }
    }
    else {
      DEFAULT_ATTRIBUTE *temp;
      int count = type->allocDefaultAtts * 2;
      temp = (DEFAULT_ATTRIBUTE *)
        REALLOC(parser, type->defaultAtts, (count * sizeof(DEFAULT_ATTRIBUTE)));
      if (temp == NULL)
        return 0;
      type->allocDefaultAtts = count;
      type->defaultAtts = temp;
    }
  }
  att = type->defaultAtts + type->nDefaultAtts;
  att->id = attId;
  att->value = value;
  att->isCdata = isCdata;
  if (!isCdata)
    attId->maybeTokenized = XML_TRUE;
  type->nDefaultAtts += 1;
  return 1;
}